

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

bool google::protobuf::compiler::ApplyMapping
               (string *filename,string *old_prefix,string *new_prefix,string *result)

{
  pointer pcVar1;
  ulong size;
  pointer __s2;
  short *psVar2;
  char *pcVar3;
  size_t size_00;
  short *psVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  string after_prefix;
  short *local_50;
  ulong local_48;
  short local_40 [8];
  
  uVar6 = old_prefix->_M_string_length;
  if (uVar6 != 0) {
    pcVar1 = (filename->_M_dataplus)._M_p;
    size = filename->_M_string_length;
    if ((long)size < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
      uVar6 = old_prefix->_M_string_length;
    }
    __s2 = (old_prefix->_M_dataplus)._M_p;
    if ((long)uVar6 < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig(uVar6,"string length exceeds max size");
    }
    if (size < uVar6) {
      return false;
    }
    iVar5 = bcmp(pcVar1,__s2,uVar6);
    if (iVar5 != 0) {
      return false;
    }
    uVar6 = old_prefix->_M_string_length;
    if (filename->_M_string_length == uVar6) {
      std::__cxx11::string::_M_assign((string *)result);
      return true;
    }
    pcVar1 = (filename->_M_dataplus)._M_p;
    if (pcVar1[uVar6] == '/') {
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    else if (pcVar1[uVar6 - 1] != '/') {
      return false;
    }
    if ((int)uVar6 == -1) {
      return false;
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)filename);
    iVar5 = std::__cxx11::string::compare((char *)&local_50);
    psVar2 = local_50;
    if (iVar5 != 0) {
      if (-1 < (long)local_48) {
        if (2 < local_48) goto LAB_00338122;
LAB_0033816c:
        bVar8 = false;
        lVar7 = std::__cxx11::string::find((char *)&local_50,0x4330a1,0);
        if (lVar7 == -1) {
          std::__cxx11::string::_M_assign((string *)result);
          if (result->_M_string_length != 0) {
            std::__cxx11::string::push_back((char)result);
          }
          bVar8 = true;
          std::__cxx11::string::_M_append((char *)result,(ulong)local_50);
        }
        goto LAB_003381dd;
      }
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_48,"string length exceeds max size");
LAB_00338122:
      psVar4 = local_50;
      if ((char)psVar2[1] != '/' || *psVar2 != 0x2e2e) {
        if ((long)local_48 < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (local_48,"string length exceeds max size");
        }
        else if (local_48 < 3) goto LAB_0033816c;
        if (*(char *)((long)psVar4 + (local_48 - 1)) != '.' ||
            *(short *)((long)psVar4 + (local_48 - 3)) != 0x2e2f) goto LAB_0033816c;
      }
    }
    bVar8 = false;
LAB_003381dd:
    if (local_50 == local_40) {
      return bVar8;
    }
    operator_delete(local_50);
    return bVar8;
  }
  iVar5 = std::__cxx11::string::compare((char *)filename);
  if (iVar5 == 0) {
    return false;
  }
  psVar2 = (short *)(filename->_M_dataplus)._M_p;
  uVar6 = filename->_M_string_length;
  if ((long)uVar6 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(uVar6,"string length exceeds max size");
LAB_00337ff1:
    if ((char)psVar2[1] == '/' && *psVar2 == 0x2e2e) {
      return false;
    }
    pcVar1 = (filename->_M_dataplus)._M_p;
    uVar6 = filename->_M_string_length;
    if ((long)uVar6 < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig(uVar6,"string length exceeds max size");
    }
    else if (uVar6 < 3) goto LAB_0033803c;
    if (pcVar1[uVar6 - 1] == '.' && *(short *)(pcVar1 + (uVar6 - 3)) == 0x2e2f) {
      return false;
    }
  }
  else if (2 < uVar6) goto LAB_00337ff1;
LAB_0033803c:
  lVar7 = std::__cxx11::string::find((char *)filename,0x4330a1,0);
  if (lVar7 != -1) {
    return false;
  }
  pcVar3 = (filename->_M_dataplus)._M_p;
  size_00 = filename->_M_string_length;
  if ((long)size_00 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size_00,"string length exceeds max size");
  }
  else if (size_00 == 0) goto LAB_0033807a;
  if (*pcVar3 == '/') {
    return false;
  }
LAB_0033807a:
  std::__cxx11::string::_M_assign((string *)result);
  if (result->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)result);
  }
  std::__cxx11::string::_M_append((char *)result,(ulong)(filename->_M_dataplus)._M_p);
  return true;
}

Assistant:

static bool ApplyMapping(const std::string& filename,
                         const std::string& old_prefix,
                         const std::string& new_prefix, std::string* result) {
  if (old_prefix.empty()) {
    // old_prefix matches any relative path.
    if (ContainsParentReference(filename)) {
      // We do not allow the file name to use "..".
      return false;
    }
    if (HasPrefixString(filename, "/") || IsWindowsAbsolutePath(filename)) {
      // This is an absolute path, so it isn't matched by the empty string.
      return false;
    }
    result->assign(new_prefix);
    if (!result->empty()) result->push_back('/');
    result->append(filename);
    return true;
  } else if (HasPrefixString(filename, old_prefix)) {
    // old_prefix is a prefix of the filename.  Is it the whole filename?
    if (filename.size() == old_prefix.size()) {
      // Yep, it's an exact match.
      *result = new_prefix;
      return true;
    } else {
      // Not an exact match.  Is the next character a '/'?  Otherwise,
      // this isn't actually a match at all.  E.g. the prefix "foo/bar"
      // does not match the filename "foo/barbaz".
      int after_prefix_start = -1;
      if (filename[old_prefix.size()] == '/') {
        after_prefix_start = old_prefix.size() + 1;
      } else if (filename[old_prefix.size() - 1] == '/') {
        // old_prefix is never empty, and canonicalized paths never have
        // consecutive '/' characters.
        after_prefix_start = old_prefix.size();
      }
      if (after_prefix_start != -1) {
        // Yep.  So the prefixes are directories and the filename is a file
        // inside them.
        std::string after_prefix = filename.substr(after_prefix_start);
        if (ContainsParentReference(after_prefix)) {
          // We do not allow the file name to use "..".
          return false;
        }
        result->assign(new_prefix);
        if (!result->empty()) result->push_back('/');
        result->append(after_prefix);
        return true;
      }
    }
  }

  return false;
}